

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O2

double __thiscall
MADPComponentFactoredStates::GetInitialStateProbability(MADPComponentFactoredStates *this,Index sI)

{
  double dVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sfacValues;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GetInitialStateProbability(Index sI)",(allocator<char> *)&local_50
            );
  AssureInitialized(this,&local_38);
  dVar1 = (double)std::__cxx11::string::~string((string *)&local_38);
  StateIndexToFactorValueIndices
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,this,sI);
  (*(this->_m_initialStateDistribution->super_StateDistribution)._vptr_StateDistribution[8])
            (this->_m_initialStateDistribution,&local_50);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_50);
  return dVar1;
}

Assistant:

double MADPComponentFactoredStates::GetInitialStateProbability(Index sI) const
{
    AssureInitialized("GetInitialStateProbability(Index sI)"); 
    vector<Index> sfacValues = StateIndexToFactorValueIndices(sI);
    return(_m_initialStateDistribution->GetProbability(sfacValues) );
}